

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  short sVar1;
  StkId pTVar2;
  int iVar3;
  ptrdiff_t fr;
  int wanted;
  StkId res;
  StkId pTStack_20;
  int nres_local;
  StkId firstResult_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  if (L->magic != '*') {
    __assert_fail("L->magic == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x18a,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
  }
  if (ci->magic == '*') {
    sVar1 = ci->nresults;
    pTStack_20 = firstResult;
    if ((L->hookmask & 6) != 0) {
      if ((L->hookmask & 2) != 0) {
        pTVar2 = L->stack;
        luaD_hook(L,1,-1);
        pTStack_20 = (StkId)((long)L->stack + ((long)firstResult - (long)pTVar2));
      }
      L->oldpc = (ci->previous->u).l.savedpc;
    }
    pTVar2 = ci->func;
    L->ci = ci->previous;
    iVar3 = moveresults(L,pTStack_20,pTVar2,nres,(int)sVar1);
    return iVar3;
  }
  __assert_fail("ci->magic == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                ,0x18b,"int luaD_poscall(lua_State *, CallInfo *, StkId, int)");
}

Assistant:

int luaD_poscall (lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
  StkId res;
  lua_assert(L->magic == 42);
  lua_assert(ci->magic == 42);
  int wanted = ci->nresults;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  L->ci = ci->previous;  /* back to caller */
  /* move results to proper place */
  return moveresults(L, firstResult, res, nres, wanted);
}